

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NewFrame(void)

{
  ImDrawListFlags *pIVar1;
  ImDrawList *pIVar2;
  float *pfVar3;
  ImGuiNavMoveResult *pIVar4;
  bool *pbVar5;
  int *piVar6;
  ImGuiNextWindowData *pIVar7;
  ImVec2 *pIVar8;
  float fVar9;
  ImGuiID IVar10;
  ImGuiInputSource IVar11;
  ImGuiID IVar12;
  ImFontAtlas *pIVar13;
  ImGuiWindow **ppIVar14;
  ImGuiPopupData *pIVar15;
  ImGuiContext *pIVar16;
  ImGuiContext *pIVar17;
  ImGuiContext *pIVar18;
  ImGuiContext *pIVar19;
  bool bVar20;
  int i;
  int iVar21;
  int iVar22;
  long lVar23;
  ImGuiWindow *pIVar24;
  ulong uVar25;
  ImGuiWindow **__dest;
  ImGuiPopupData *__dest_00;
  int i_1;
  ImGuiWindow *window_00;
  char *pcVar26;
  ImGuiWindow *parent_window;
  ImGuiWindow *pIVar27;
  ImGuiContext *g_4;
  byte bVar28;
  ImGuiWindow *old_nav_window;
  ImGuiNavMoveResult *pIVar29;
  ImRect *pIVar30;
  float *pfVar31;
  ImGuiNavLayer IVar32;
  ImFont *font;
  float *pfVar33;
  ImGuiWindow *window;
  ImGuiContext *g_1;
  ImGuiContext *g;
  ulong uVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  byte bVar38;
  uint uVar39;
  uint uVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  ImVec2 IVar44;
  ImVec2 IVar45;
  ImVec2 IVar46;
  double dVar47;
  ImVec2 IVar48;
  ImVec2 IVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  ImVec2 IVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  ImRect local_40;
  
  pIVar16 = GImGui;
  bVar38 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xdfc,"void ImGui::NewFrame()");
  }
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xde4,"void NewFrameSanityChecks()");
  }
  if (((GImGui->IO).DeltaTime <= 0.0) && (GImGui->FrameCount != 0)) {
    __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xde5,"void NewFrameSanityChecks()");
  }
  if ((GImGui->FrameCount != 0) && (GImGui->FrameCountEnded != GImGui->FrameCount)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xde6,"void NewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xde7,"void NewFrameSanityChecks()");
  }
  pIVar13 = (GImGui->IO).Fonts;
  if ((pIVar13->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xde8,"void NewFrameSanityChecks()");
  }
  if ((*(pIVar13->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xde9,"void NewFrameSanityChecks()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xdea,"void NewFrameSanityChecks()");
  }
  fVar41 = (GImGui->Style).Alpha;
  if ((fVar41 < 0.0) || (1.0 < fVar41)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xdeb,"void NewFrameSanityChecks()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xdec,"void NewFrameSanityChecks()");
  }
  if (2 < (GImGui->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xded,"void NewFrameSanityChecks()");
  }
  lVar23 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar23] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*g.IO.KeysDown))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0xdef,"void NewFrameSanityChecks()");
    }
    lVar23 = lVar23 + 1;
  } while (lVar23 != 0x16);
  if ((((GImGui->IO).ConfigFlags & 1) != 0) && ((GImGui->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xdf3,"void NewFrameSanityChecks()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar16->SettingsLoaded == false) {
    if ((pIVar16->SettingsWindows).Buf.Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0xe09,"void ImGui::NewFrame()");
    }
    pcVar26 = (pIVar16->IO).IniFilename;
    if (pcVar26 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar26);
    }
    pIVar16->SettingsLoaded = true;
  }
  if ((0.0 < pIVar16->SettingsDirtyTimer) &&
     (fVar41 = pIVar16->SettingsDirtyTimer - (pIVar16->IO).DeltaTime,
     pIVar16->SettingsDirtyTimer = fVar41, fVar41 <= 0.0)) {
    pcVar26 = (pIVar16->IO).IniFilename;
    if (pcVar26 == (char *)0x0) {
      (pIVar16->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar26);
    }
    pIVar16->SettingsDirtyTimer = 0.0;
  }
  pIVar16->Time = (double)(pIVar16->IO).DeltaTime + pIVar16->Time;
  pIVar16->WithinFrameScope = true;
  pIVar16->FrameCount = pIVar16->FrameCount + 1;
  pIVar16->TooltipOverrideCount = 0;
  pIVar16->WindowsActiveCount = 0;
  ((pIVar16->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    pIVar13 = (GImGui->IO).Fonts;
    if ((pIVar13->Fonts).Size < 1) {
      pcVar26 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_001db977:
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.h"
                    ,0x503,pcVar26);
    }
    font = *(pIVar13->Fonts).Data;
  }
  SetCurrentFont(font);
  if (pIVar16->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xe26,"void ImGui::NewFrame()");
  }
  fVar41 = (pIVar16->IO).DisplaySize.x;
  fVar42 = (pIVar16->IO).DisplaySize.y;
  (pIVar16->DrawListSharedData).ClipRectFullscreen.x = 0.0;
  (pIVar16->DrawListSharedData).ClipRectFullscreen.y = 0.0;
  (pIVar16->DrawListSharedData).ClipRectFullscreen.z = fVar41;
  (pIVar16->DrawListSharedData).ClipRectFullscreen.w = fVar42;
  (pIVar16->DrawListSharedData).CurveTessellationTol = (pIVar16->Style).CurveTessellationTol;
  uVar39 = (uint)(pIVar16->Style).AntiAliasedLines;
  (pIVar16->DrawListSharedData).InitialFlags = uVar39;
  if ((pIVar16->Style).AntiAliasedFill == true) {
    (pIVar16->DrawListSharedData).InitialFlags = uVar39 | 2;
  }
  if (((pIVar16->IO).BackendFlags & 8) != 0) {
    pIVar1 = &(pIVar16->DrawListSharedData).InitialFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 4;
  }
  pIVar2 = &pIVar16->BackgroundDrawList;
  ImDrawList::Clear(pIVar2);
  ImDrawList::PushTextureID(pIVar2,((pIVar16->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar2);
  pIVar2 = &pIVar16->ForegroundDrawList;
  ImDrawList::Clear(pIVar2);
  ImDrawList::PushTextureID(pIVar2,((pIVar16->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar2);
  (pIVar16->DrawData).Valid = false;
  (pIVar16->DrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar16->DrawData).CmdListsCount = 0;
  (pIVar16->DrawData).TotalIdxCount = 0;
  (pIVar16->DrawData).TotalVtxCount = 0;
  (pIVar16->DrawData).DisplayPos.x = 0.0;
  *(undefined8 *)&(pIVar16->DrawData).DisplayPos.y = 0;
  (pIVar16->DrawData).DisplaySize.x = 0.0;
  (pIVar16->DrawData).DisplaySize.y = 0.0;
  (pIVar16->DrawData).FramebufferScale.x = 0.0;
  pIVar17 = GImGui;
  (pIVar16->DrawData).FramebufferScale.y = 0.0;
  if ((pIVar16->DragDropActive == true) &&
     (IVar10 = (pIVar16->DragDropPayload).SourceId, IVar10 == pIVar16->ActiveId)) {
    if (GImGui->ActiveId == IVar10) {
      GImGui->ActiveIdIsAlive = IVar10;
    }
    if (pIVar17->ActiveIdPreviousFrame == IVar10) {
      pIVar17->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar16->HoveredIdPreviousFrame == 0) {
    pIVar16->HoveredIdTimer = 0.0;
LAB_001d8fe1:
    pIVar16->HoveredIdNotActiveTimer = 0.0;
  }
  else if ((pIVar16->HoveredId != 0) && (pIVar16->ActiveId == pIVar16->HoveredId))
  goto LAB_001d8fe1;
  IVar10 = pIVar16->HoveredId;
  if ((IVar10 != 0) &&
     (pIVar16->HoveredIdTimer = (pIVar16->IO).DeltaTime + pIVar16->HoveredIdTimer,
     pIVar16->ActiveId != IVar10)) {
    pIVar16->HoveredIdNotActiveTimer = (pIVar16->IO).DeltaTime + pIVar16->HoveredIdNotActiveTimer;
  }
  pIVar16->HoveredIdPreviousFrame = IVar10;
  pIVar16->HoveredId = 0;
  pIVar16->HoveredIdAllowOverlap = false;
  IVar10 = pIVar16->ActiveId;
  if (((pIVar16->ActiveIdIsAlive != IVar10) && (IVar10 != 0)) &&
     (pIVar16->ActiveIdPreviousFrame == IVar10)) {
    ClearActiveID();
  }
  IVar10 = pIVar16->ActiveId;
  if (IVar10 != 0) {
    pIVar16->ActiveIdTimer = (pIVar16->IO).DeltaTime + pIVar16->ActiveIdTimer;
  }
  pIVar16->LastActiveIdTimer = (pIVar16->IO).DeltaTime + pIVar16->LastActiveIdTimer;
  pIVar16->ActiveIdPreviousFrame = IVar10;
  pIVar16->ActiveIdPreviousFrameWindow = pIVar16->ActiveIdWindow;
  pIVar16->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar16->ActiveIdHasBeenEditedBefore;
  pIVar16->ActiveIdIsAlive = 0;
  pIVar16->ActiveIdHasBeenEditedThisFrame = false;
  pIVar16->ActiveIdPreviousFrameIsAlive = false;
  pIVar16->ActiveIdIsJustActivated = false;
  if (IVar10 != pIVar16->TempInputTextId && pIVar16->TempInputTextId != 0) {
    pIVar16->TempInputTextId = 0;
  }
  if (IVar10 == 0) {
    pIVar16->ActiveIdUsingNavDirMask = 0;
    pIVar16->ActiveIdUsingNavInputMask = 0;
    pIVar16->ActiveIdUsingKeyInputMask = 0;
  }
  pIVar16->DragDropAcceptIdPrev = pIVar16->DragDropAcceptIdCurr;
  pIVar16->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar16->DragDropAcceptIdCurr = 0;
  pIVar16->DragDropWithinSourceOrTarget = false;
  pfVar3 = (pIVar16->IO).KeysDownDuration;
  memcpy((pIVar16->IO).KeysDownDurationPrev,pfVar3,0x800);
  lVar23 = 0;
  do {
    fVar41 = -1.0;
    if ((pIVar16->IO).KeysDown[lVar23] == true) {
      fVar41 = 0.0;
      if (0.0 <= pfVar3[lVar23]) {
        fVar41 = pfVar3[lVar23] + (pIVar16->IO).DeltaTime;
      }
    }
    pfVar3[lVar23] = fVar41;
    pIVar17 = GImGui;
    lVar23 = lVar23 + 1;
  } while (lVar23 != 0x200);
  (GImGui->IO).WantSetMousePos = false;
  uVar39 = (pIVar17->IO).ConfigFlags;
  if ((uVar39 & 2) == 0) {
    bVar28 = 0;
  }
  else {
    bVar28 = (byte)(pIVar17->IO).BackendFlags & 1;
  }
  if ((bVar28 != 0) &&
     (((0.0 < (pIVar17->IO).NavInputs[0] || (0.0 < (pIVar17->IO).NavInputs[2])) ||
      ((0.0 < (pIVar17->IO).NavInputs[1] || (0.0 < (pIVar17->IO).NavInputs[3])))))) {
    pIVar17->NavInputSource = ImGuiInputSource_NavGamepad;
  }
  if ((uVar39 & 1) != 0) {
    iVar22 = (pIVar17->IO).KeyMap[0xc];
    if (-1 < (long)iVar22) {
      if (0x1ff < iVar22) goto LAB_001db981;
      if ((pIVar17->IO).KeysDown[iVar22] == true) {
        (pIVar17->IO).NavInputs[0] = 1.0;
        pIVar17->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar22 = (pIVar17->IO).KeyMap[0xd];
    if (-1 < (long)iVar22) {
      if (0x1ff < iVar22) goto LAB_001db981;
      if ((pIVar17->IO).KeysDown[iVar22] == true) {
        (pIVar17->IO).NavInputs[2] = 1.0;
        pIVar17->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar22 = (pIVar17->IO).KeyMap[0xe];
    if (-1 < (long)iVar22) {
      if (0x1ff < iVar22) goto LAB_001db981;
      if ((pIVar17->IO).KeysDown[iVar22] == true) {
        (pIVar17->IO).NavInputs[1] = 1.0;
        pIVar17->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar22 = (pIVar17->IO).KeyMap[1];
    if (-1 < (long)iVar22) {
      if (0x1ff < iVar22) goto LAB_001db981;
      if ((pIVar17->IO).KeysDown[iVar22] == true) {
        (pIVar17->IO).NavInputs[0x11] = 1.0;
        pIVar17->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar22 = (pIVar17->IO).KeyMap[2];
    if (-1 < (long)iVar22) {
      if (0x1ff < iVar22) goto LAB_001db981;
      if ((pIVar17->IO).KeysDown[iVar22] == true) {
        (pIVar17->IO).NavInputs[0x12] = 1.0;
        pIVar17->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar22 = (pIVar17->IO).KeyMap[3];
    if (-1 < (long)iVar22) {
      if (0x1ff < iVar22) goto LAB_001db981;
      if ((pIVar17->IO).KeysDown[iVar22] == true) {
        (pIVar17->IO).NavInputs[0x13] = 1.0;
        pIVar17->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar22 = (pIVar17->IO).KeyMap[4];
    if (-1 < (long)iVar22) {
      if (0x1ff < iVar22) {
LAB_001db981:
        __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(g.IO.KeysDown) / sizeof(*g.IO.KeysDown)))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                      ,0x10c7,"bool ImGui::IsKeyDown(int)");
      }
      if ((pIVar17->IO).KeysDown[iVar22] == true) {
        (pIVar17->IO).NavInputs[0x14] = 1.0;
        pIVar17->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    bVar35 = (pIVar17->IO).KeyCtrl;
    if (bVar35 == true) {
      (pIVar17->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar17->IO).KeyShift == true) {
      (pIVar17->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar35 == false) && ((pIVar17->IO).KeyAlt != false)) {
      (pIVar17->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar3 = (pIVar17->IO).NavInputsDownDuration;
  pfVar31 = pfVar3;
  pfVar33 = (pIVar17->IO).NavInputsDownDurationPrev;
  for (lVar23 = 0x15; lVar23 != 0; lVar23 = lVar23 + -1) {
    *pfVar33 = *pfVar31;
    pfVar31 = pfVar31 + (ulong)bVar38 * -2 + 1;
    pfVar33 = pfVar33 + (ulong)bVar38 * -2 + 1;
  }
  lVar23 = 0;
  do {
    fVar41 = -1.0;
    if (0.0 < (pIVar17->IO).NavInputs[lVar23]) {
      fVar41 = 0.0;
      if (0.0 <= pfVar3[lVar23]) {
        fVar41 = pfVar3[lVar23] + (pIVar17->IO).DeltaTime;
      }
    }
    pfVar3[lVar23] = fVar41;
    lVar23 = lVar23 + 1;
  } while (lVar23 != 0x15);
  IVar10 = pIVar17->NavInitResultId;
  if ((IVar10 != 0) &&
     (((pIVar17->NavDisableHighlight != true || (pIVar17->NavInitRequestFromMove == true)) &&
      (pIVar17->NavWindow != (ImGuiWindow *)0x0)))) {
    IVar32 = pIVar17->NavLayer;
    if (pIVar17->NavInitRequestFromMove == true) {
      SetNavID(IVar10,IVar32,0);
      IVar44 = (pIVar17->NavInitResultRectRel).Max;
      pIVar8 = &pIVar17->NavWindow->NavRectRel[(int)IVar32].Min;
      *pIVar8 = (pIVar17->NavInitResultRectRel).Min;
      pIVar8[1] = IVar44;
      pIVar17->NavMousePosDirty = true;
      pIVar17->NavDisableHighlight = false;
      pIVar17->NavDisableMouseHover = true;
    }
    else {
      SetNavID(IVar10,IVar32,0);
    }
    IVar44 = (pIVar17->NavInitResultRectRel).Max;
    pIVar8 = &pIVar17->NavWindow->NavRectRel[pIVar17->NavLayer].Min;
    *pIVar8 = (pIVar17->NavInitResultRectRel).Min;
    pIVar8[1] = IVar44;
  }
  pIVar17->NavInitRequest = false;
  pIVar17->NavInitRequestFromMove = false;
  pIVar17->NavInitResultId = 0;
  pIVar17->NavJustMovedToId = 0;
  pIVar18 = GImGui;
  if (pIVar17->NavMoveRequest == true) {
    IVar10 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar10 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      if (GImGui->NavId != 0) {
        pIVar18->NavDisableHighlight = false;
        pIVar18->NavDisableMouseHover = true;
      }
    }
    else {
      pIVar4 = &GImGui->NavMoveResultOther;
      pIVar29 = &GImGui->NavMoveResultLocal;
      if (IVar10 == 0) {
        pIVar29 = pIVar4;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20U) != 0) &&
          (IVar10 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar10 != 0)) &&
         (IVar10 != GImGui->NavId)) {
        pIVar29 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (((pIVar29 != pIVar4) && ((GImGui->NavMoveResultOther).ID != 0)) &&
         (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar41 = (GImGui->NavMoveResultOther).DistBox;
        fVar42 = pIVar29->DistBox;
        if (fVar42 <= fVar41) {
          if (((fVar41 != fVar42) || (NAN(fVar41) || NAN(fVar42))) ||
             (pfVar3 = &(GImGui->NavMoveResultOther).DistCenter,
             pIVar29->DistCenter < *pfVar3 || pIVar29->DistCenter == *pfVar3)) goto LAB_001d959f;
        }
        pIVar29 = pIVar4;
      }
LAB_001d959f:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) ||
         (pIVar24 = pIVar29->Window, pIVar24 == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                      ,0x218c,"void ImGui::NavUpdateMoveResult()");
      }
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        if ((GImGui->NavMoveRequestFlags & 0x40U) == 0) {
          fVar41 = (pIVar29->Window->Pos).x;
          fVar42 = (pIVar29->Window->Pos).y;
          local_40.Min.x = (pIVar29->RectRel).Min.x + fVar41;
          local_40.Max.x = fVar41 + (pIVar29->RectRel).Max.x;
          local_40.Min.y = (pIVar29->RectRel).Min.y + fVar42;
          local_40.Max.y = fVar42 + (pIVar29->RectRel).Max.y;
          IVar44 = ScrollToBringRectIntoView(pIVar29->Window,&local_40);
        }
        else {
          fVar41 = 0.0;
          if (GImGui->NavMoveDir == 2) {
            fVar41 = (pIVar24->ScrollMax).y;
          }
          IVar44 = (ImVec2)((ulong)(uint)((pIVar24->Scroll).y - fVar41) << 0x20);
          (pIVar24->ScrollTarget).y = fVar41;
          (pIVar24->ScrollTargetCenterRatio).y = 0.0;
        }
        fVar41 = (pIVar29->RectRel).Min.y;
        (pIVar29->RectRel).Min.x = (pIVar29->RectRel).Min.x - IVar44.x;
        (pIVar29->RectRel).Max.x = (pIVar29->RectRel).Max.x - IVar44.x;
        (pIVar29->RectRel).Min.y = fVar41 - IVar44.y;
        (pIVar29->RectRel).Max.y = (pIVar29->RectRel).Max.y - IVar44.y;
      }
      ClearActiveID();
      pIVar18->NavWindow = pIVar29->Window;
      IVar10 = pIVar29->ID;
      if (pIVar18->NavId != IVar10) {
        pIVar18->NavJustMovedToId = IVar10;
        pIVar18->NavJustMovedToFocusScopeId = pIVar29->FocusScopeId;
      }
      pIVar19 = GImGui;
      IVar32 = pIVar18->NavLayer;
      SetNavID(IVar10,IVar32,pIVar29->FocusScopeId);
      IVar44 = (pIVar29->RectRel).Max;
      pIVar8 = &pIVar19->NavWindow->NavRectRel[(int)IVar32].Min;
      *pIVar8 = (pIVar29->RectRel).Min;
      pIVar8[1] = IVar44;
      pIVar19->NavMousePosDirty = true;
      pIVar19->NavDisableHighlight = false;
      pIVar19->NavDisableMouseHover = true;
      pIVar18->NavMoveFromClampedRefRect = false;
    }
  }
  if (pIVar17->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar17->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x2097,"void ImGui::NavUpdate()");
    }
    if (((pIVar17->NavMoveResultLocal).ID == 0) && ((pIVar17->NavMoveResultOther).ID == 0)) {
      pIVar17->NavDisableHighlight = false;
    }
    pIVar17->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar17->NavMousePosDirty == true) && (pIVar17->NavIdIsAlive == true)) {
    if ((((pIVar17->IO).ConfigFlags & 4) != 0) &&
       ((((((pIVar17->IO).BackendFlags & 4) != 0 && (pIVar17->NavDisableHighlight == false)) &&
         (pIVar17->NavDisableMouseHover == true)) && (pIVar17->NavWindow != (ImGuiWindow *)0x0)))) {
      IVar44 = NavCalcPreferredRefPos();
      (pIVar17->IO).MousePosPrev = IVar44;
      (pIVar17->IO).MousePos = IVar44;
      (pIVar17->IO).WantSetMousePos = true;
    }
    pIVar17->NavMousePosDirty = false;
  }
  pIVar17->NavIdIsAlive = false;
  pIVar17->NavJustTabbedId = 0;
  IVar32 = pIVar17->NavLayer;
  if (ImGuiNavLayer_Menu < IVar32) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x20ad,"void ImGui::NavUpdate()");
  }
  pIVar24 = pIVar17->NavWindow;
  pIVar27 = pIVar24;
  if (pIVar24 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar27->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar27 != pIVar24) {
          pIVar27->NavLastChildNavWindow = pIVar24;
        }
        break;
      }
      ppIVar14 = &pIVar27->ParentWindow;
      pIVar27 = *ppIVar14;
    } while (*ppIVar14 != (ImGuiWindow *)0x0);
    if (((pIVar24 != (ImGuiWindow *)0x0) && (IVar32 == ImGuiNavLayer_Main)) &&
       (pIVar24->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar24->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar18 = GImGui;
  pIVar24 = GetTopMostPopupModal();
  if (pIVar24 == (ImGuiWindow *)0x0) {
    if ((pIVar18->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
       (pIVar18->NavWindowingTarget == (ImGuiWindow *)0x0)) {
      fVar41 = (pIVar18->IO).DeltaTime * -10.0 + pIVar18->NavWindowingHighlightAlpha;
      fVar41 = (float)(-(uint)(0.0 <= fVar41) & (uint)fVar41);
      pIVar18->NavWindowingHighlightAlpha = fVar41;
      if ((pIVar18->DimBgRatio <= 0.0) && (fVar41 <= 0.0)) {
        pIVar18->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
      }
    }
    if (pIVar18->NavWindowingTarget == (ImGuiWindow *)0x0) {
      bVar35 = (pIVar18->IO).NavInputsDownDuration[3] == 0.0;
      if ((((pIVar18->IO).KeyCtrl != true) || (iVar22 = (pIVar18->IO).KeyMap[0], iVar22 < 0)) ||
         (bVar37 = IsKeyPressed(iVar22,true), !bVar37)) goto LAB_001d98f1;
      bVar38 = (byte)(pIVar18->IO).ConfigFlags & 1;
    }
    else {
      bVar35 = false;
LAB_001d98f1:
      bVar38 = 0;
    }
    if (bVar35 || bVar38 != 0) {
      pIVar24 = pIVar18->NavWindow;
      if (pIVar24 == (ImGuiWindow *)0x0) {
        pIVar24 = FindWindowNavFocusable((pIVar18->WindowsFocusOrder).Size + -1,-0x7fffffff,-1);
      }
      if (pIVar24 != (ImGuiWindow *)0x0) {
        pIVar18->NavWindowingTargetAnim = pIVar24;
        pIVar18->NavWindowingTarget = pIVar24;
        pIVar18->NavWindowingTimer = 0.0;
        pIVar18->NavWindowingHighlightAlpha = 0.0;
        pIVar18->NavWindowingToggleLayer = (bool)(bVar38 ^ 1);
        pIVar18->NavInputSource = ImGuiInputSource_NavGamepad - bVar38;
      }
    }
    fVar41 = (pIVar18->IO).DeltaTime + pIVar18->NavWindowingTimer;
    pIVar18->NavWindowingTimer = fVar41;
    if ((pIVar18->NavWindowingTarget == (ImGuiWindow *)0x0) ||
       (pIVar18->NavInputSource != ImGuiInputSource_NavGamepad)) {
LAB_001d9a47:
      bVar35 = false;
      pIVar24 = (ImGuiWindow *)0x0;
    }
    else {
      fVar42 = (fVar41 + -0.2) / 0.05;
      fVar41 = 1.0;
      if (fVar42 <= 1.0) {
        fVar41 = fVar42;
      }
      fVar41 = (float)(~-(uint)(fVar42 < 0.0) & (uint)fVar41);
      uVar40 = -(uint)(fVar41 <= pIVar18->NavWindowingHighlightAlpha);
      pIVar18->NavWindowingHighlightAlpha =
           (float)(uVar40 & (uint)pIVar18->NavWindowingHighlightAlpha | ~uVar40 & (uint)fVar41);
      fVar41 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
      fVar42 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
      iVar22 = (uint)(0.0 < fVar41) - (uint)(0.0 < fVar42);
      if (iVar22 != 0) {
        NavUpdateWindowingHighlightWindow(iVar22);
        pIVar18->NavWindowingHighlightAlpha = 1.0;
      }
      if (0.0 < (GImGui->IO).NavInputs[3]) goto LAB_001d9a47;
      pbVar5 = &pIVar18->NavWindowingToggleLayer;
      *pbVar5 = (bool)(*pbVar5 &
                      (pIVar18->NavWindowingHighlightAlpha <= 1.0 &&
                      pIVar18->NavWindowingHighlightAlpha != 1.0));
      if (*pbVar5 == false) {
        pIVar24 = pIVar18->NavWindowingTarget;
        bVar35 = false;
      }
      else {
        bVar35 = pIVar18->NavWindow != (ImGuiWindow *)0x0;
        pIVar24 = (ImGuiWindow *)0x0;
      }
      pIVar18->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    if ((pIVar18->NavWindowingTarget != (ImGuiWindow *)0x0) &&
       (pIVar18->NavInputSource == ImGuiInputSource_NavKeyboard)) {
      fVar42 = (pIVar18->NavWindowingTimer + -0.2) / 0.05;
      fVar41 = 1.0;
      if (fVar42 <= 1.0) {
        fVar41 = fVar42;
      }
      fVar41 = (float)(~-(uint)(fVar42 < 0.0) & (uint)fVar41);
      uVar40 = -(uint)(fVar41 <= pIVar18->NavWindowingHighlightAlpha);
      pIVar18->NavWindowingHighlightAlpha =
           (float)(uVar40 & (uint)pIVar18->NavWindowingHighlightAlpha | ~uVar40 & (uint)fVar41);
      iVar22 = (GImGui->IO).KeyMap[0];
      if ((-1 < iVar22) && (bVar37 = IsKeyPressed(iVar22,true), bVar37)) {
        NavUpdateWindowingHighlightWindow((pIVar18->IO).KeyShift - 1 | 1);
      }
      if ((pIVar18->IO).KeyCtrl == false) {
        pIVar24 = pIVar18->NavWindowingTarget;
      }
    }
    pIVar19 = GImGui;
    fVar41 = (GImGui->IO).NavInputsDownDuration[0x10];
    if ((fVar41 == 0.0) && (!NAN(fVar41))) {
      pIVar18->NavWindowingToggleLayer = true;
    }
    bVar37 = bVar35;
    if ((((pIVar18->ActiveId == 0) || (pIVar18->ActiveIdAllowOverlap == true)) && (fVar41 < 0.0)) &&
       ((pIVar18->NavWindowingToggleLayer != false &&
        (0.0 <= (pIVar19->IO).NavInputsDownDurationPrev[0x10])))) {
      bVar36 = IsMousePosValid(&(pIVar18->IO).MousePos);
      bVar20 = IsMousePosValid(&(pIVar18->IO).MousePosPrev);
      bVar37 = true;
      if (bVar20 != bVar36) {
        bVar37 = bVar35;
      }
    }
    pIVar27 = pIVar18->NavWindowingTarget;
    if ((pIVar27 != (ImGuiWindow *)0x0) && ((pIVar27->Flags & 4) == 0)) {
      IVar11 = pIVar18->NavInputSource;
      IVar44.x = 0.0;
      IVar44.y = 0.0;
      if ((IVar11 == ImGuiInputSource_NavKeyboard) && ((pIVar18->IO).KeyShift == false)) {
        IVar44 = GetNavInputAmount2d(1,ImGuiInputReadMode_Down,0.0,0.0);
      }
      if (IVar11 == ImGuiInputSource_NavGamepad) {
        IVar44 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.0,0.0);
      }
      fVar41 = IVar44.y;
      if (((IVar44.x != 0.0) || (fVar41 != 0.0)) || (NAN(fVar41))) {
        fVar42 = (pIVar18->IO).DisplayFramebufferScale.x;
        fVar50 = (pIVar18->IO).DisplayFramebufferScale.y;
        if (fVar50 <= fVar42) {
          fVar42 = fVar50;
        }
        fVar42 = (float)(int)(fVar42 * (pIVar18->IO).DeltaTime * 800.0);
        pIVar27 = pIVar27->RootWindow;
        local_40.Min.x = IVar44.x * fVar42 + (pIVar27->Pos).x;
        local_40.Min.y = fVar41 * fVar42 + (pIVar27->Pos).y;
        SetWindowPos(pIVar27,&local_40.Min,1);
        pIVar18->NavDisableMouseHover = true;
        if (((pIVar18->NavWindowingTarget->Flags & 0x100) == 0) &&
           (GImGui->SettingsDirtyTimer <= 0.0)) {
          GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
        }
      }
    }
    if (pIVar24 != (ImGuiWindow *)0x0) {
      if ((pIVar18->NavWindow == (ImGuiWindow *)0x0) || (pIVar24 != pIVar18->NavWindow->RootWindow))
      {
        ClearActiveID();
        pIVar18->NavDisableHighlight = false;
        pIVar18->NavDisableMouseHover = true;
        pIVar27 = pIVar24->NavLastChildNavWindow;
        if (pIVar24->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
          pIVar27 = pIVar24;
        }
        ClosePopupsOverWindow(pIVar27,false);
        FocusWindow(pIVar27);
        if (pIVar27->NavLastIds[0] == 0) {
          NavInitWindow(pIVar27,false);
        }
        if ((pIVar27->DC).NavLayerActiveMask == 2) {
          pIVar18->NavLayer = ImGuiNavLayer_Menu;
        }
      }
      pIVar18->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    if ((bVar37) && (pIVar24 = pIVar18->NavWindow, pIVar27 = pIVar24, pIVar24 != (ImGuiWindow *)0x0)
       ) {
      while (window_00 = pIVar27, window_00->ParentWindow != (ImGuiWindow *)0x0) {
        if ((((window_00->DC).NavLayerActiveMask & 2) != 0) ||
           (pIVar27 = window_00->ParentWindow, (window_00->Flags & 0x15000000U) != 0x1000000))
        break;
      }
      if (window_00 != pIVar24) {
        FocusWindow(window_00);
        window_00->NavLastChildNavWindow = pIVar24;
      }
      pIVar18->NavDisableHighlight = false;
      pIVar18->NavDisableMouseHover = true;
      IVar32 = ImGuiNavLayer_Main;
      if (((pIVar18->NavWindow->DC).NavLayerActiveMask & 2) != 0) {
        IVar32 = pIVar18->NavLayer ^ ImGuiNavLayer_Menu;
      }
      NavRestoreLayer(IVar32);
    }
  }
  else {
    pIVar18->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((((uVar39 & 1) == 0 & (bVar28 ^ 1)) == 0) && (pIVar17->NavWindow != (ImGuiWindow *)0x0)) {
    bVar35 = (pIVar17->NavWindow->Flags & 0x40000U) == 0;
    (pIVar17->IO).NavActive = bVar35;
    if (((!bVar35) || (pIVar17->NavId == 0)) ||
       (bVar35 = true, pIVar17->NavDisableHighlight != false)) goto LAB_001d9dd2;
  }
  else {
    (pIVar17->IO).NavActive = false;
LAB_001d9dd2:
    bVar35 = pIVar17->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  (pIVar17->IO).NavVisible = bVar35;
  fVar41 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar41 == 0.0) && (!NAN(fVar41))) {
    if (pIVar17->ActiveId == 0) {
      pIVar24 = pIVar17->NavWindow;
      if (((pIVar24 == (ImGuiWindow *)0x0) || ((pIVar24->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar24->ParentWindow == (ImGuiWindow *)0x0)) {
        iVar22 = (pIVar17->OpenPopupStack).Size;
        if ((long)iVar22 < 1) {
          if (pIVar17->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar24 != (ImGuiWindow *)0x0) && ((pIVar24->Flags & 0x5000000U) != 0x1000000)) {
              pIVar24->NavLastIds[0] = 0;
            }
            pIVar17->NavId = 0;
            pIVar17->NavFocusScopeId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else if ((((pIVar17->OpenPopupStack).Data[(long)iVar22 + -1].Window)->Flags & 0x8000000) ==
                 0) {
          ClosePopupToLevel(iVar22 + -1,true);
        }
      }
      else {
        if (pIVar24->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                        ,0x20c9,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar24->ParentWindow);
        pIVar18 = GImGui;
        pIVar27 = GImGui->NavWindow;
        if (pIVar27 == (ImGuiWindow *)0x0) {
          __assert_fail("g.NavWindow",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                        ,0x1e8e,"void ImGui::SetNavID(ImGuiID, int, ImGuiID)");
        }
        IVar10 = pIVar24->ChildId;
        GImGui->NavId = IVar10;
        pIVar18->NavFocusScopeId = 0;
        pIVar27->NavLastIds[0] = IVar10;
        pIVar17->NavIdIsAlive = false;
        if (pIVar17->NavDisableMouseHover == true) {
          pIVar17->NavMousePosDirty = true;
        }
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      ClearActiveID();
    }
  }
  pIVar17->NavActivateId = 0;
  pIVar17->NavActivateDownId = 0;
  pIVar17->NavActivatePressedId = 0;
  pIVar18 = GImGui;
  pIVar17->NavInputId = 0;
  IVar10 = pIVar17->NavId;
  if ((((IVar10 != 0) && (pIVar17->NavDisableHighlight == false)) &&
      (pIVar17->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
     ((pIVar17->NavWindow != (ImGuiWindow *)0x0 && ((pIVar17->NavWindow->Flags & 0x40000) == 0)))) {
    fVar41 = (GImGui->IO).NavInputs[0];
    if (0.0 < fVar41) {
      bVar35 = (GImGui->IO).NavInputsDownDuration[0] == 0.0;
    }
    else {
      bVar35 = false;
    }
    IVar12 = pIVar17->ActiveId;
    if (bVar35 && IVar12 == 0) {
      pIVar17->NavActivateId = IVar10;
    }
    if (IVar12 == 0) {
      if (0.0 < fVar41) goto LAB_001db643;
    }
    else if (IVar12 == IVar10 && 0.0 < fVar41) {
LAB_001db643:
      pIVar17->NavActivateDownId = IVar10;
    }
    if (IVar12 == 0) {
      if (bVar35) goto LAB_001db659;
    }
    else if ((bool)(bVar35 & IVar12 == IVar10)) {
LAB_001db659:
      pIVar17->NavActivatePressedId = IVar10;
    }
    if (((IVar12 == 0 || IVar12 == IVar10) &&
        (fVar41 = (pIVar18->IO).NavInputsDownDuration[2], fVar41 == 0.0)) && (!NAN(fVar41))) {
      pIVar17->NavInputId = IVar10;
    }
  }
  pIVar24 = pIVar17->NavWindow;
  if ((pIVar24 != (ImGuiWindow *)0x0) && ((pIVar24->Flags & 0x40000) != 0)) {
    pIVar17->NavDisableHighlight = true;
  }
  IVar10 = pIVar17->NavActivateId;
  if ((IVar10 != 0) && (pIVar17->NavActivateDownId != IVar10)) {
    __assert_fail("g.NavActivateDownId == g.NavActivateId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x20f7,"void ImGui::NavUpdate()");
  }
  pIVar17->NavMoveRequest = false;
  IVar10 = pIVar17->NavNextActivateId;
  if (IVar10 != 0) {
    pIVar17->NavInputId = IVar10;
    pIVar17->NavActivatePressedId = IVar10;
    pIVar17->NavActivateDownId = IVar10;
    pIVar17->NavActivateId = IVar10;
  }
  pIVar17->NavNextActivateId = 0;
  if (pIVar17->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar17->NavMoveDir = -1;
    pIVar17->NavMoveRequestFlags = 0;
    if (((pIVar24 != (ImGuiWindow *)0x0) && (pIVar17->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar24->Flags & 0x40000) == 0)) {
      uVar40 = GImGui->ActiveIdUsingNavDirMask;
      if (((uVar40 & 1) == 0) &&
         ((fVar41 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar41 ||
          (fVar41 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar41)))) {
        pIVar17->NavMoveDir = 0;
      }
      if (((uVar40 & 2) == 0) &&
         ((fVar41 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar41 ||
          (fVar41 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar41)))) {
        pIVar17->NavMoveDir = 1;
      }
      if (((uVar40 & 4) == 0) &&
         ((fVar41 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar41 ||
          (fVar41 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar41)))) {
        pIVar17->NavMoveDir = 2;
      }
      if (((uVar40 & 8) == 0) &&
         ((fVar41 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar41 ||
          (fVar41 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat), 0.0 < fVar41)))) {
        pIVar17->NavMoveDir = 3;
      }
    }
    pIVar17->NavMoveClipDir = pIVar17->NavMoveDir;
  }
  else {
    if ((pIVar17->NavMoveDir == -1) || (pIVar17->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x2112,"void ImGui::NavUpdate()");
    }
    if (pIVar17->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x2113,"void ImGui::NavUpdate()");
    }
    pIVar17->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar18 = GImGui;
  fVar41 = 0.0;
  if (((((uVar39 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
      (pIVar24 = GImGui->NavWindow, pIVar24 != (ImGuiWindow *)0x0)) &&
     ((((pIVar24->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
      (GImGui->NavLayer == ImGuiNavLayer_Main)))) {
    bVar35 = IsKeyDown((GImGui->IO).KeyMap[5]);
    bVar37 = false;
    bVar36 = false;
    if (bVar35) {
      bVar36 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    bVar35 = IsKeyDown((pIVar18->IO).KeyMap[6]);
    if (bVar35) {
      bVar37 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar35 = IsKeyPressed((pIVar18->IO).KeyMap[7],true);
    if (bVar35) {
      bVar35 = (GImGui->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar35 = false;
    }
    bVar20 = IsKeyPressed((pIVar18->IO).KeyMap[8],true);
    if (bVar20) {
      bVar20 = (GImGui->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar20 = false;
    }
    fVar41 = 0.0;
    if ((bVar36 != bVar37) || (bVar35 != bVar20)) {
      if (((pIVar24->DC).NavLayerActiveMask == 0) && ((pIVar24->DC).NavHasScroll == true)) {
        bVar37 = IsKeyPressed((pIVar18->IO).KeyMap[5],true);
        if (bVar37) {
          (pIVar24->ScrollTarget).y =
               (pIVar24->Scroll).y - ((pIVar24->InnerRect).Max.y - (pIVar24->InnerRect).Min.y);
LAB_001db90f:
          (pIVar24->ScrollTargetCenterRatio).y = 0.0;
        }
        else {
          bVar37 = IsKeyPressed((pIVar18->IO).KeyMap[6],true);
          if (bVar37) {
            fVar41 = ((pIVar24->InnerRect).Max.y - (pIVar24->InnerRect).Min.y) + (pIVar24->Scroll).y
            ;
LAB_001db908:
            (pIVar24->ScrollTarget).y = fVar41;
            goto LAB_001db90f;
          }
          if (bVar35 == false) {
            if (bVar20 != false) {
              fVar41 = (pIVar24->ScrollMax).y;
              goto LAB_001db908;
            }
          }
          else {
            (pIVar24->ScrollTarget).y = 0.0;
            (pIVar24->ScrollTargetCenterRatio).y = 0.0;
          }
        }
LAB_001db918:
        fVar41 = 0.0;
      }
      else {
        IVar32 = pIVar18->NavLayer;
        pIVar30 = pIVar24->NavRectRel + IVar32;
        fVar41 = GImGui->FontBaseSize * pIVar24->FontWindowScale;
        if (pIVar24->ParentWindow != (ImGuiWindow *)0x0) {
          fVar41 = fVar41 * pIVar24->ParentWindow->FontWindowScale;
        }
        fVar41 = (pIVar24->NavRectRel[IVar32].Max.y - pIVar24->NavRectRel[IVar32].Min.y) +
                 (((pIVar24->InnerRect).Max.y - (pIVar24->InnerRect).Min.y) - fVar41);
        fVar41 = (float)(~-(uint)(fVar41 <= 0.0) & (uint)fVar41);
        bVar37 = IsKeyPressed((pIVar18->IO).KeyMap[5],true);
        if (bVar37) {
          fVar41 = -fVar41;
          pIVar18->NavMoveDir = 3;
          pIVar18->NavMoveClipDir = 2;
          pIVar18->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar37 = IsKeyPressed((pIVar18->IO).KeyMap[6],true);
          if (bVar37) {
            pIVar18->NavMoveDir = 2;
            pIVar18->NavMoveClipDir = 3;
            pIVar18->NavMoveRequestFlags = 0x30;
          }
          else {
            if (bVar35 != false) {
              fVar41 = -(pIVar24->Scroll).y;
              pIVar24->NavRectRel[IVar32].Max.y = fVar41;
              pIVar24->NavRectRel[IVar32].Min.y = fVar41;
              fVar41 = (pIVar30->Min).x;
              pIVar8 = &pIVar24->NavRectRel[IVar32].Max;
              if (pIVar8->x <= fVar41 && fVar41 != pIVar8->x) {
                pIVar24->NavRectRel[IVar32].Max.x = 0.0;
                (pIVar30->Min).x = 0.0;
              }
              pIVar18->NavMoveDir = 3;
              pIVar18->NavMoveRequestFlags = 0x50;
              goto LAB_001db918;
            }
            fVar41 = 0.0;
            if (bVar20 != false) {
              fVar42 = ((pIVar24->ScrollMax).y + (pIVar24->SizeFull).y) - (pIVar24->Scroll).y;
              pIVar24->NavRectRel[IVar32].Max.y = fVar42;
              pIVar24->NavRectRel[IVar32].Min.y = fVar42;
              fVar42 = (pIVar30->Min).x;
              pIVar8 = &pIVar24->NavRectRel[IVar32].Max;
              if (pIVar8->x <= fVar42 && fVar42 != pIVar8->x) {
                pIVar24->NavRectRel[IVar32].Max.x = 0.0;
                (pIVar30->Min).x = 0.0;
              }
              pIVar18->NavMoveDir = 2;
              pIVar18->NavMoveRequestFlags = 0x50;
            }
          }
        }
      }
    }
  }
  uVar39 = pIVar17->NavMoveDir;
  if (uVar39 != 0xffffffff) {
    pIVar17->NavMoveRequest = true;
    pIVar17->NavMoveDirLast = uVar39;
  }
  bVar35 = pIVar17->NavMoveRequest;
  if ((bVar35 == true) && (pIVar17->NavId == 0)) {
    pIVar17->NavInitRequest = true;
    pIVar17->NavInitRequestFromMove = true;
    pIVar17->NavInitResultId = 0;
    pIVar17->NavDisableHighlight = false;
  }
  pIVar18 = GImGui;
  if (GImGui->NavMoveRequest == false) {
    pbVar5 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar5;
    if (*pbVar5 != false) goto LAB_001da24c;
  }
  else {
    GImGui->NavAnyRequest = true;
LAB_001da24c:
    if (pIVar18->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x2002,"void ImGui::NavUpdateAnyRequestFlag()");
    }
  }
  pIVar24 = pIVar17->NavWindow;
  if (((pIVar24 != (ImGuiWindow *)0x0) && ((pIVar24->Flags & 0x40000) == 0)) &&
     (pIVar17->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar42 = pIVar18->FontBaseSize * pIVar24->FontWindowScale;
    if (pIVar24->ParentWindow != (ImGuiWindow *)0x0) {
      fVar42 = fVar42 * pIVar24->ParentWindow->FontWindowScale;
    }
    fVar42 = (float)(int)(fVar42 * 100.0 * (pIVar17->IO).DeltaTime + 0.5);
    if (((pIVar24->DC).NavLayerActiveMask == 0) && (((pIVar24->DC).NavHasScroll & bVar35) == 1)) {
      if (uVar39 < 2) {
        (pIVar24->ScrollTarget).x =
             (float)(int)(*(float *)(&DAT_002a8b08 + (ulong)(uVar39 == 0) * 4) * fVar42 +
                         (pIVar24->Scroll).x);
        (pIVar24->ScrollTargetCenterRatio).x = 0.0;
      }
      if ((uVar39 & 0xfffffffe) == 2) {
        (pIVar24->ScrollTarget).y =
             (float)(int)(*(float *)(&DAT_002a8b08 + (ulong)(uVar39 == 2) * 4) * fVar42 +
                         (pIVar24->Scroll).y);
        (pIVar24->ScrollTargetCenterRatio).y = 0.0;
      }
    }
    IVar44 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar50 = IVar44.x;
    fVar43 = IVar44.y;
    if (((fVar50 != 0.0) || (NAN(fVar50))) && (pIVar24->ScrollbarX == true)) {
      (pIVar24->ScrollTarget).x = (float)(int)(fVar50 * fVar42 + (pIVar24->Scroll).x);
      (pIVar24->ScrollTargetCenterRatio).x = 0.0;
      pIVar17->NavMoveFromClampedRefRect = true;
    }
    if ((fVar43 != 0.0) || (NAN(fVar43))) {
      (pIVar24->ScrollTarget).y = (float)(int)(fVar43 * fVar42 + (pIVar24->Scroll).y);
      (pIVar24->ScrollTargetCenterRatio).y = 0.0;
      pIVar17->NavMoveFromClampedRefRect = true;
    }
  }
  (pIVar17->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar17->NavMoveResultLocal).ID = 0;
  (pIVar17->NavMoveResultLocal).FocusScopeId = 0;
  (pIVar17->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar17->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar17->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar17->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (pIVar17->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (pIVar17->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (pIVar17->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (pIVar17->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar17->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar17->NavMoveResultLocalVisibleSet).FocusScopeId = 0;
  (pIVar17->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar17->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar17->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar17->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (pIVar17->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (pIVar17->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (pIVar17->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (pIVar17->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar17->NavMoveResultOther).ID = 0;
  (pIVar17->NavMoveResultOther).FocusScopeId = 0;
  (pIVar17->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar17->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar17->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar17->NavMoveResultOther).RectRel.Min.x = 0.0;
  (pIVar17->NavMoveResultOther).RectRel.Min.y = 0.0;
  (pIVar17->NavMoveResultOther).RectRel.Max.x = 0.0;
  (pIVar17->NavMoveResultOther).RectRel.Max.y = 0.0;
  if (((bVar35 != false) && (pIVar17->NavMoveFromClampedRefRect == true)) &&
     (pIVar17->NavLayer == ImGuiNavLayer_Main)) {
    fVar42 = (pIVar24->Pos).x;
    fVar50 = (pIVar24->Pos).y;
    fVar52 = ((pIVar24->InnerRect).Min.x - fVar42) + -1.0;
    fVar51 = ((pIVar24->InnerRect).Min.y - fVar50) + -1.0;
    fVar43 = ((pIVar24->InnerRect).Max.x - fVar42) + 1.0;
    fVar50 = ((pIVar24->InnerRect).Max.y - fVar50) + 1.0;
    fVar42 = pIVar24->NavRectRel[0].Min.x;
    if (((fVar42 < fVar52) || (pIVar24->NavRectRel[0].Min.y < fVar51)) ||
       ((fVar43 < pIVar24->NavRectRel[0].Max.x || (fVar50 < pIVar24->NavRectRel[0].Max.y)))) {
      fVar54 = pIVar18->FontBaseSize * pIVar24->FontWindowScale;
      if (pIVar24->ParentWindow != (ImGuiWindow *)0x0) {
        fVar54 = fVar54 * pIVar24->ParentWindow->FontWindowScale;
      }
      fVar54 = fVar54 * 0.5;
      fVar55 = fVar43 - fVar52;
      if (fVar54 <= fVar43 - fVar52) {
        fVar55 = fVar54;
      }
      fVar56 = fVar50 - fVar51;
      if (fVar54 <= fVar50 - fVar51) {
        fVar56 = fVar54;
      }
      uVar39 = -(uint)(fVar52 + fVar55 <= fVar42);
      fVar54 = pIVar24->NavRectRel[0].Min.y;
      fVar9 = pIVar24->NavRectRel[0].Max.x;
      uVar40 = -(uint)(fVar51 + fVar56 <= fVar54);
      pIVar24->NavRectRel[0].Min.x =
           (float)(uVar39 & (uint)fVar42 | ~uVar39 & (uint)(fVar52 + fVar55));
      pIVar24->NavRectRel[0].Min.y =
           (float)(uVar40 & (uint)fVar54 | ~uVar40 & (uint)(fVar51 + fVar56));
      if (fVar43 - fVar55 <= fVar9) {
        fVar9 = fVar43 - fVar55;
      }
      fVar42 = pIVar24->NavRectRel[0].Max.y;
      if (fVar50 - fVar56 <= fVar42) {
        fVar42 = fVar50 - fVar56;
      }
      IVar53.y = fVar42;
      IVar53.x = fVar9;
      pIVar24->NavRectRel[0].Max = IVar53;
      pIVar17->NavId = 0;
      pIVar17->NavFocusScopeId = 0;
    }
    pIVar17->NavMoveFromClampedRefRect = false;
  }
  pIVar24 = pIVar17->NavWindow;
  if (pIVar24 == (ImGuiWindow *)0x0) {
LAB_001da627:
    fVar51 = 0.0;
    fVar50 = 0.0;
    fVar43 = 0.0;
    fVar42 = 0.0;
  }
  else {
    IVar32 = pIVar17->NavLayer;
    fVar42 = pIVar24->NavRectRel[IVar32].Min.x;
    fVar50 = pIVar24->NavRectRel[IVar32].Max.x;
    if (fVar50 < fVar42) goto LAB_001da627;
    fVar43 = pIVar24->NavRectRel[IVar32].Min.y;
    fVar51 = pIVar24->NavRectRel[IVar32].Max.y;
    if (fVar51 < fVar43) goto LAB_001da627;
  }
  if (pIVar24 == (ImGuiWindow *)0x0) {
    fVar50 = (GImGui->IO).DisplaySize.x;
    fVar51 = (GImGui->IO).DisplaySize.y;
    fVar42 = 0.0;
    fVar43 = 0.0;
  }
  else {
    fVar52 = (pIVar24->Pos).x;
    fVar54 = (pIVar24->Pos).y;
    fVar42 = fVar42 + fVar52;
    fVar43 = fVar43 + fVar54;
    fVar50 = fVar50 + fVar52;
    fVar51 = fVar51 + fVar54;
  }
  (pIVar17->NavScoringRectScreen).Min.x = fVar42;
  (pIVar17->NavScoringRectScreen).Min.y = fVar43;
  (pIVar17->NavScoringRectScreen).Max.x = fVar50;
  (pIVar17->NavScoringRectScreen).Max.y = fVar51;
  fVar43 = (pIVar17->NavScoringRectScreen).Min.y + fVar41;
  (pIVar17->NavScoringRectScreen).Min.y = fVar43;
  fVar41 = fVar41 + (pIVar17->NavScoringRectScreen).Max.y;
  (pIVar17->NavScoringRectScreen).Max.y = fVar41;
  fVar50 = (pIVar17->NavScoringRectScreen).Min.x + 1.0;
  fVar42 = (pIVar17->NavScoringRectScreen).Max.x;
  if (fVar42 <= fVar50) {
    fVar50 = fVar42;
  }
  (pIVar17->NavScoringRectScreen).Min.x = fVar50;
  (pIVar17->NavScoringRectScreen).Max.x = fVar50;
  if (fVar41 < fVar43) {
    __assert_fail("!g.NavScoringRectScreen.IsInverted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x2164,"void ImGui::NavUpdate()");
  }
  pIVar17->NavScoringCount = 0;
  pIVar17 = GImGui;
  pIVar8 = &(GImGui->IO).MousePos;
  bVar35 = IsMousePosValid(pIVar8);
  if (bVar35) {
    IVar45.x = (float)(int)(pIVar17->IO).MousePos.x;
    IVar45.y = (float)(int)(pIVar17->IO).MousePos.y;
    pIVar17->LastValidMousePos = IVar45;
    (pIVar17->IO).MousePos = IVar45;
  }
  bVar35 = IsMousePosValid(pIVar8);
  if ((bVar35) && (bVar35 = IsMousePosValid(&(pIVar17->IO).MousePosPrev), bVar35)) {
    IVar46.x = (pIVar17->IO).MousePos.x - (pIVar17->IO).MousePosPrev.x;
    IVar46.y = (pIVar17->IO).MousePos.y - (pIVar17->IO).MousePosPrev.y;
    (pIVar17->IO).MouseDelta = IVar46;
  }
  else {
    (pIVar17->IO).MouseDelta.x = 0.0;
    (pIVar17->IO).MouseDelta.y = 0.0;
  }
  if ((((pIVar17->IO).MouseDelta.x != 0.0) || (fVar41 = (pIVar17->IO).MouseDelta.y, fVar41 != 0.0))
     || (NAN(fVar41))) {
    pIVar17->NavDisableMouseHover = false;
  }
  (pIVar17->IO).MousePosPrev = (pIVar17->IO).MousePos;
  lVar23 = -5;
  do {
    fVar41 = -1.0;
    bVar35 = (pIVar17->IO).MouseDown[lVar23 + 5];
    if (bVar35 == true) {
      pfVar3 = (pIVar17->IO).MouseDownDurationPrev + lVar23;
      bVar37 = *pfVar3 <= 0.0 && *pfVar3 != 0.0;
    }
    else {
      bVar37 = false;
    }
    (pIVar17->IO).MouseDoubleClicked[lVar23] = bVar37;
    if (bVar35 == false) {
      bVar36 = 0.0 <= (pIVar17->IO).MouseDownDurationPrev[lVar23];
    }
    else {
      bVar36 = false;
    }
    (pIVar17->IO).MouseDownOwned[lVar23] = bVar36;
    fVar42 = (pIVar17->IO).MouseDownDurationPrev[lVar23];
    (&(pIVar17->IO).MouseDragMaxDistanceAbs[0].x)[lVar23] = fVar42;
    if ((bVar35 != false) && (fVar41 = 0.0, 0.0 <= fVar42)) {
      fVar41 = fVar42 + (pIVar17->IO).DeltaTime;
    }
    (pIVar17->IO).MouseDownDurationPrev[lVar23] = fVar41;
    (pIVar17->IO).MouseReleased[lVar23] = false;
    if (bVar37 == false) {
      if (bVar35 != false) {
        bVar35 = IsMousePosValid(pIVar8);
        fVar41 = 0.0;
        fVar42 = 0.0;
        if (bVar35) {
          fVar41 = (pIVar17->IO).MousePos.x - *(float *)((pIVar17->IO).MouseClickedTime + lVar23);
          fVar42 = (pIVar17->IO).MousePos.y -
                   *(float *)((long)(pIVar17->IO).MouseClickedTime + lVar23 * 8 + 4);
        }
        fVar50 = (pIVar17->IO).KeysDownDuration[lVar23];
        fVar43 = -fVar42;
        if (-fVar42 <= fVar42) {
          fVar43 = fVar42;
        }
        fVar42 = fVar41 * fVar41 + fVar42 * fVar42;
        uVar39 = -(uint)(fVar42 <= fVar50);
        (pIVar17->IO).KeysDownDuration[lVar23] =
             (float)(~uVar39 & (uint)fVar42 | (uint)fVar50 & uVar39);
        fVar42 = -fVar41;
        if (-fVar41 <= fVar41) {
          fVar42 = fVar41;
        }
        fVar41 = (pIVar17->IO).MouseDragMaxDistanceSqr[lVar23 * 2];
        fVar50 = (pIVar17->IO).MouseDragMaxDistanceSqr[lVar23 * 2 + 1];
        uVar39 = -(uint)(fVar42 <= fVar41);
        (pIVar17->IO).MouseDragMaxDistanceSqr[lVar23 * 2] =
             (float)(~uVar39 & (uint)fVar42 | (uint)fVar41 & uVar39);
        uVar39 = -(uint)(fVar43 <= fVar50);
        (pIVar17->IO).MouseDragMaxDistanceSqr[lVar23 * 2 + 1] =
             (float)(~uVar39 & (uint)fVar43 | (uint)fVar50 & uVar39);
      }
    }
    else {
      dVar47 = pIVar17->Time;
      if ((float)(dVar47 - *(double *)((pIVar17->IO).MouseClicked + lVar23 * 8)) <
          (pIVar17->IO).MouseDoubleClickTime) {
        bVar35 = IsMousePosValid(pIVar8);
        fVar41 = 0.0;
        fVar42 = 0.0;
        if (bVar35) {
          fVar41 = (pIVar17->IO).MousePos.x - *(float *)((pIVar17->IO).MouseClickedTime + lVar23);
          fVar42 = (pIVar17->IO).MousePos.y -
                   *(float *)((long)(pIVar17->IO).MouseClickedTime + lVar23 * 8 + 4);
        }
        fVar50 = (pIVar17->IO).MouseDoubleClickMaxDist;
        dVar47 = -3.4028234663852886e+38;
        if (fVar41 * fVar41 + fVar42 * fVar42 < fVar50 * fVar50) {
          (pIVar17->IO).MouseReleased[lVar23] = true;
          dVar47 = -3.4028234663852886e+38;
        }
      }
      *(double *)((pIVar17->IO).MouseClicked + lVar23 * 8) = dVar47;
      *(ImVec2 *)((pIVar17->IO).MouseClickedTime + lVar23) = (pIVar17->IO).MousePos;
      *(bool *)((long)(pIVar17->IO).MouseDownDuration + lVar23 + -3) =
           (pIVar17->IO).MouseReleased[lVar23];
      pfVar3 = (pIVar17->IO).MouseDragMaxDistanceSqr + lVar23 * 2;
      pfVar3[0] = 0.0;
      pfVar3[1] = 0.0;
      (pIVar17->IO).KeysDownDuration[lVar23] = 0.0;
    }
    if (((pIVar17->IO).MouseDown[lVar23 + 5] == false) &&
       ((pIVar17->IO).MouseDownOwned[lVar23] == false)) {
      *(undefined1 *)((long)(pIVar17->IO).MouseDownDuration + lVar23 + -3) = 0;
    }
    if ((pIVar17->IO).MouseDoubleClicked[lVar23] == true) {
      pIVar17->NavDisableMouseHover = false;
    }
    lVar23 = lVar23 + 1;
  } while (lVar23 != 0);
  fVar41 = (pIVar16->IO).DeltaTime;
  iVar22 = pIVar16->FramerateSecPerFrameIdx;
  pIVar16->FramerateSecPerFrameAccum =
       (fVar41 - pIVar16->FramerateSecPerFrame[iVar22]) + pIVar16->FramerateSecPerFrameAccum;
  pIVar16->FramerateSecPerFrame[iVar22] = fVar41;
  iVar21 = iVar22 + (int)((ulong)((long)(iVar22 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar16->FramerateSecPerFrameIdx = iVar22 + 1 + ((iVar21 >> 6) - (iVar21 >> 0x1f)) * -0x78;
  uVar39 = -(uint)(0.0 < pIVar16->FramerateSecPerFrameAccum);
  (pIVar16->IO).Framerate =
       (float)(~uVar39 & 0x7f7fffff |
              (uint)(1.0 / (pIVar16->FramerateSecPerFrameAccum / 120.0)) & uVar39);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar24 = GetTopMostPopupModal();
  if ((pIVar24 != (ImGuiWindow *)0x0) ||
     ((pIVar16->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar16->NavWindowingHighlightAlpha)))) {
    fVar41 = (pIVar16->IO).DeltaTime * 6.0 + pIVar16->DimBgRatio;
    if (1.0 <= fVar41) {
      fVar41 = 1.0;
    }
    pIVar16->DimBgRatio = fVar41;
  }
  else {
    fVar41 = (pIVar16->IO).DeltaTime * -10.0 + pIVar16->DimBgRatio;
    pIVar16->DimBgRatio = (float)(-(uint)(0.0 <= fVar41) & (uint)fVar41);
  }
  pIVar16->MouseCursor = 0;
  pIVar16->WantTextInputNextFrame = -1;
  pIVar16->WantCaptureMouseNextFrame = -1;
  pIVar16->WantCaptureKeyboardNextFrame = -1;
  (pIVar16->PlatformImePos).x = 1.0;
  pIVar17 = GImGui;
  (pIVar16->PlatformImePos).y = 1.0;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar35 = IsMousePosValid((ImVec2 *)0x0);
    if ((bVar35) &&
       (fVar41 = (pIVar17->IO).MouseDragThreshold,
       fVar42 = (pIVar17->IO).MousePos.x - (pIVar17->WheelingWindowRefMousePos).x,
       fVar50 = (pIVar17->IO).MousePos.y - (pIVar17->WheelingWindowRefMousePos).y,
       fVar41 * fVar41 < fVar42 * fVar42 + fVar50 * fVar50)) {
      pIVar17->WheelingWindowTimer = 0.0;
    }
    if (pIVar17->WheelingWindowTimer <= 0.0) {
      pIVar17->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar17->WheelingWindowTimer = 0.0;
    }
  }
  pIVar18 = GImGui;
  fVar41 = (pIVar17->IO).MouseWheel;
  if (((fVar41 != 0.0) || (fVar42 = (pIVar17->IO).MouseWheelH, fVar42 != 0.0)) || (NAN(fVar42))) {
    pIVar24 = pIVar17->WheelingWindow;
    if (pIVar24 == (ImGuiWindow *)0x0) {
      pIVar24 = pIVar17->HoveredWindow;
    }
    if ((pIVar24 != (ImGuiWindow *)0x0) && (pIVar24->Collapsed == false)) {
      fVar42 = 0.0;
      if ((fVar41 != 0.0) || (NAN(fVar41))) {
        if (((pIVar17->IO).KeyCtrl == true) && ((pIVar17->IO).FontAllowUserScaling == true)) {
          if (GImGui->WheelingWindow != pIVar24) {
            GImGui->WheelingWindow = pIVar24;
            pIVar18->WheelingWindowRefMousePos = (pIVar18->IO).MousePos;
            pIVar18->WheelingWindowTimer = 2.0;
          }
          fVar41 = pIVar24->FontWindowScale;
          fVar50 = (pIVar17->IO).MouseWheel * 0.1 + fVar41;
          fVar42 = 2.5;
          if (fVar50 <= 2.5) {
            fVar42 = fVar50;
          }
          fVar42 = (float)(-(uint)(fVar50 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar50 < 0.5) & (uint)fVar42);
          pIVar24->FontWindowScale = fVar42;
          if ((pIVar24->Flags & 0x1000000) == 0) {
            fVar42 = fVar42 / fVar41;
            fVar41 = (pIVar24->Size).x;
            fVar50 = (pIVar24->Size).y;
            fVar43 = (pIVar24->Pos).x;
            fVar51 = (pIVar24->Pos).y;
            local_40.Min.y =
                 (((pIVar17->IO).MousePos.y - fVar51) * (1.0 - fVar42) * fVar50) / fVar50 + fVar51;
            local_40.Min.x =
                 (((pIVar17->IO).MousePos.x - fVar43) * (1.0 - fVar42) * fVar41) / fVar41 + fVar43;
            SetWindowPos(pIVar24,&local_40.Min,0);
            IVar48.x = (float)(int)((pIVar24->Size).x * fVar42);
            IVar48.y = (float)(int)((pIVar24->Size).y * fVar42);
            pIVar24->Size = IVar48;
            IVar49.x = (float)(int)((pIVar24->SizeFull).x * fVar42);
            IVar49.y = (float)(int)(fVar42 * (pIVar24->SizeFull).y);
            pIVar24->SizeFull = IVar49;
          }
          goto LAB_001db13e;
        }
        if ((pIVar17->IO).KeyShift == false) {
          fVar42 = fVar41;
        }
      }
      if (((fVar42 != 0.0) || (NAN(fVar42))) && ((pIVar17->IO).KeyCtrl == false)) {
        if (GImGui->WheelingWindow != pIVar24) {
          GImGui->WheelingWindow = pIVar24;
          pIVar18->WheelingWindowRefMousePos = (pIVar18->IO).MousePos;
          pIVar18->WheelingWindowTimer = 2.0;
        }
        uVar39 = pIVar24->Flags;
        while (((uVar39 >> 0x18 & 1) != 0 &&
               (((uVar39 & 0x210) == 0x10 ||
                ((fVar41 = (pIVar24->ScrollMax).y, fVar41 == 0.0 && (!NAN(fVar41)))))))) {
          pIVar24 = pIVar24->ParentWindow;
          uVar39 = pIVar24->Flags;
        }
        if ((uVar39 & 0x210) == 0) {
          fVar41 = ((pIVar24->InnerRect).Max.y - (pIVar24->InnerRect).Min.y) * 0.67;
          fVar50 = pIVar18->FontBaseSize * pIVar24->FontWindowScale;
          if (pIVar24->ParentWindow != (ImGuiWindow *)0x0) {
            fVar50 = fVar50 * pIVar24->ParentWindow->FontWindowScale;
          }
          fVar43 = fVar50 * 5.0;
          if (fVar41 <= fVar50 * 5.0) {
            fVar43 = fVar41;
          }
          (pIVar24->ScrollTarget).y = (pIVar24->Scroll).y - fVar42 * (float)(int)fVar43;
          (pIVar24->ScrollTargetCenterRatio).y = 0.0;
        }
      }
      pIVar18 = GImGui;
      fVar41 = (pIVar17->IO).MouseWheelH;
      if (((fVar41 == 0.0) && (!NAN(fVar41))) || ((pIVar17->IO).KeyShift == true)) {
        fVar42 = (pIVar17->IO).MouseWheel;
        if ((fVar42 != 0.0) || (NAN(fVar42))) {
          fVar41 = 0.0;
          if ((pIVar17->IO).KeyShift == true) {
            fVar41 = fVar42;
          }
        }
        else {
          fVar41 = 0.0;
        }
      }
      if (((fVar41 != 0.0) || (NAN(fVar41))) && ((pIVar17->IO).KeyCtrl == false)) {
        if (GImGui->WheelingWindow != pIVar24) {
          GImGui->WheelingWindow = pIVar24;
          pIVar18->WheelingWindowRefMousePos = (pIVar18->IO).MousePos;
          pIVar18->WheelingWindowTimer = 2.0;
        }
        while ((uVar39 = pIVar24->Flags, (uVar39 >> 0x18 & 1) != 0 &&
               (((uVar39 & 0x210) == 0x10 ||
                ((fVar42 = (pIVar24->ScrollMax).x, fVar42 == 0.0 && (!NAN(fVar42)))))))) {
          pIVar24 = pIVar24->ParentWindow;
        }
        if ((uVar39 & 0x210) == 0) {
          fVar42 = ((pIVar24->InnerRect).Max.x - (pIVar24->InnerRect).Min.x) * 0.67;
          fVar50 = pIVar18->FontBaseSize * pIVar24->FontWindowScale;
          if (pIVar24->ParentWindow != (ImGuiWindow *)0x0) {
            fVar50 = fVar50 * pIVar24->ParentWindow->FontWindowScale;
          }
          fVar43 = fVar50 + fVar50;
          if (fVar42 <= fVar50 + fVar50) {
            fVar43 = fVar42;
          }
          (pIVar24->ScrollTarget).x = (pIVar24->Scroll).x - fVar41 * (float)(int)fVar43;
          (pIVar24->ScrollTargetCenterRatio).x = 0.0;
        }
      }
    }
  }
LAB_001db13e:
  pIVar24 = pIVar16->NavWindow;
  if (((pIVar24 == (ImGuiWindow *)0x0) || (pIVar24->Active != true)) ||
     (((pIVar24->Flags & 0x40000) != 0 ||
      (((pIVar16->IO).KeyCtrl != false || (iVar22 = (GImGui->IO).KeyMap[0], iVar22 < 0)))))) {
    bVar35 = false;
  }
  else {
    bVar35 = IsKeyPressed(iVar22,true);
  }
  pIVar16->FocusTabPressed = bVar35;
  if ((bVar35 != false) && (pIVar16->ActiveId == 0)) {
    pIVar16->FocusRequestNextWindow = pIVar16->NavWindow;
    pIVar16->FocusRequestNextCounterRegular = 0x7fffffff;
    if ((pIVar16->NavId == 0) || (pIVar16->NavIdTabCounter == 0x7fffffff)) {
      iVar22 = -(uint)(pIVar16->IO).KeyShift;
    }
    else {
      iVar22 = pIVar16->NavIdTabCounter + (-(uint)(pIVar16->IO).KeyShift | 1) + 1;
    }
    pIVar16->FocusRequestNextCounterTabStop = iVar22;
  }
  pIVar16->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar16->FocusRequestCurrCounterRegular = 0x7fffffff;
  pIVar16->FocusRequestCurrCounterTabStop = 0x7fffffff;
  pIVar24 = pIVar16->FocusRequestNextWindow;
  if (pIVar24 != (ImGuiWindow *)0x0) {
    pIVar16->FocusRequestCurrWindow = pIVar24;
    if ((pIVar16->FocusRequestNextCounterRegular != 0x7fffffff) &&
       (iVar22 = (pIVar24->DC).FocusCounterRegular, iVar22 != -1)) {
      pIVar16->FocusRequestCurrCounterRegular =
           (pIVar16->FocusRequestNextCounterRegular + iVar22 + 1) % (iVar22 + 1);
    }
    if ((pIVar16->FocusRequestNextCounterTabStop != 0x7fffffff) &&
       (iVar22 = (pIVar24->DC).FocusCounterTabStop, iVar22 != -1)) {
      pIVar16->FocusRequestCurrCounterTabStop =
           (pIVar16->FocusRequestNextCounterTabStop + iVar22 + 1) % (iVar22 + 1);
    }
    pIVar16->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar16->FocusRequestNextCounterRegular = 0x7fffffff;
    pIVar16->FocusRequestNextCounterTabStop = 0x7fffffff;
  }
  pIVar16->NavIdTabCounter = 0x7fffffff;
  if ((pIVar16->WindowsFocusOrder).Size != (pIVar16->Windows).Size) {
    __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xeab,"void ImGui::NewFrame()");
  }
  fVar41 = (pIVar16->IO).ConfigWindowsMemoryCompactTimer;
  if (0.0 <= fVar41) {
    fVar41 = (float)pIVar16->Time - fVar41;
  }
  else {
    fVar41 = 3.4028235e+38;
  }
  uVar39 = (pIVar16->Windows).Size;
  uVar25 = (ulong)uVar39;
  if (uVar39 != 0) {
    uVar34 = 0;
    do {
      if ((long)(int)uVar25 <= (long)uVar34) {
        pcVar26 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_001db977;
      }
      pIVar24 = (pIVar16->Windows).Data[uVar34];
      bVar35 = pIVar24->Active;
      pIVar24->WasActive = bVar35;
      pIVar24->BeginCount = 0;
      pIVar24->Active = false;
      pIVar24->WriteAccessed = false;
      if (((bVar35 == false) && (pIVar24->MemoryCompacted == false)) &&
         (pIVar24->LastTimeActive <= fVar41 && fVar41 != pIVar24->LastTimeActive)) {
        GcCompactTransientWindowBuffers(pIVar24);
      }
      uVar34 = uVar34 + 1;
      uVar25 = (ulong)(uint)(pIVar16->Windows).Size;
    } while (uVar34 != uVar25);
  }
  if ((pIVar16->NavWindow != (ImGuiWindow *)0x0) && (pIVar16->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  iVar22 = (pIVar16->CurrentWindowStack).Capacity;
  if (iVar22 < 0) {
    uVar39 = iVar22 / 2 + iVar22;
    uVar25 = 0;
    if (0 < (int)uVar39) {
      uVar25 = (ulong)uVar39;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar6 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar6 = *piVar6 + 1;
    }
    __dest = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar25 * 8,GImAllocatorUserData);
    ppIVar14 = (pIVar16->CurrentWindowStack).Data;
    if (ppIVar14 != (ImGuiWindow **)0x0) {
      memcpy(__dest,ppIVar14,(long)(pIVar16->CurrentWindowStack).Size << 3);
      ppIVar14 = (pIVar16->CurrentWindowStack).Data;
      if ((ppIVar14 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar6 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar6 = *piVar6 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar14,GImAllocatorUserData);
    }
    (pIVar16->CurrentWindowStack).Data = __dest;
    (pIVar16->CurrentWindowStack).Capacity = (int)uVar25;
  }
  (pIVar16->CurrentWindowStack).Size = 0;
  iVar22 = (pIVar16->BeginPopupStack).Capacity;
  if (iVar22 < 0) {
    uVar39 = iVar22 / 2 + iVar22;
    uVar25 = 0;
    if (0 < (int)uVar39) {
      uVar25 = (ulong)uVar39;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar6 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar6 = *piVar6 + 1;
    }
    __dest_00 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(uVar25 * 0x30,GImAllocatorUserData);
    pIVar15 = (pIVar16->BeginPopupStack).Data;
    if (pIVar15 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_00,pIVar15,(long)(pIVar16->BeginPopupStack).Size * 0x30);
      pIVar15 = (pIVar16->BeginPopupStack).Data;
      if ((pIVar15 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar6 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar6 = *piVar6 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar15,GImAllocatorUserData);
    }
    (pIVar16->BeginPopupStack).Data = __dest_00;
    (pIVar16->BeginPopupStack).Capacity = (int)uVar25;
  }
  (pIVar16->BeginPopupStack).Size = 0;
  ClosePopupsOverWindow(pIVar16->NavWindow,false);
  pIVar17 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar17->DebugItemPickerActive == true) {
    uVar39 = pIVar17->HoveredIdPreviousFrame;
    pIVar17->MouseCursor = 7;
    iVar22 = (pIVar17->IO).KeyMap[0xe];
    if ((-1 < iVar22) && (bVar35 = IsKeyPressed(iVar22,true), bVar35)) {
      pIVar17->DebugItemPickerActive = false;
    }
    pIVar18 = GImGui;
    if (uVar39 != 0 && (GImGui->IO).MouseDownDuration[0] == 0.0) {
      pIVar17->DebugItemPickerBreakId = uVar39;
      pIVar17->DebugItemPickerActive = false;
    }
    pIVar7 = &pIVar18->NextWindowData;
    *(byte *)&pIVar7->Flags = (byte)pIVar7->Flags | 0x40;
    (pIVar18->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltip();
    Text("HoveredId: 0x%08X",(ulong)uVar39);
    Text("Press ESC to abort picking.");
    TextColored((GImGui->Style).Colors + (uVar39 == 0),"Click to break in debugger!");
    EndTooltip();
  }
  pIVar17 = GImGui;
  (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
  (pIVar17->NextWindowData).SizeVal.x = 400.0;
  (pIVar17->NextWindowData).SizeVal.y = 400.0;
  (pIVar17->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  pIVar16->WithinFrameScopeWithImplicitWindow = true;
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PreNewFrame(&g);
#endif

    // Check and assert for various common IO and Configuration mistakes
    NewFrameSanityChecks();

    // Load settings on first frame (if not explicitly loaded manually before)
    if (!g.SettingsLoaded)
    {
        IM_ASSERT(g.SettingsWindows.empty());
        if (g.IO.IniFilename)
            LoadIniSettingsFromDisk(g.IO.IniFilename);
        g.SettingsLoaded = true;
    }

    // Save settings (with a delay after the last modification, so we don't spam disk too much)
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
        {
            if (g.IO.IniFilename != NULL)
                SaveIniSettingsToDisk(g.IO.IniFilename);
            else
                g.IO.WantSaveIniSettings = true;  // Let user know they can call SaveIniSettingsToMemory(). user will need to clear io.WantSaveIniSettings themselves.
            g.SettingsDirtyTimer = 0.0f;
        }
    }

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    g.BackgroundDrawList.Clear();
    g.BackgroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.BackgroundDrawList.PushClipRectFullScreen();

    g.ForegroundDrawList.Clear();
    g.ForegroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.ForegroundDrawList.PushClipRectFullScreen();

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    g.DrawData.Clear();

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Clear reference to active widget if the widget isn't alive anymore
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputTextId != 0 && g.ActiveId != g.TempInputTextId)
        g.TempInputTextId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = g.ActiveIdUsingNavInputMask = 0;
        g.ActiveIdUsingKeyInputMask = 0;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSourceOrTarget = false;

    // Update keyboard input state
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard directional navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Pressing TAB activate widget focus
    g.FocusTabPressed = (g.NavWindow && g.NavWindow->Active && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab));
    if (g.ActiveId == 0 && g.FocusTabPressed)
    {
        // Note that SetKeyboardFocusHere() sets the Next fields mid-frame. To be consistent we also
        // manipulate the Next fields even, even though they will be turned into Curr fields by the code below.
        g.FocusRequestNextWindow = g.NavWindow;
        g.FocusRequestNextCounterRegular = INT_MAX;
        if (g.NavId != 0 && g.NavIdTabCounter != INT_MAX)
            g.FocusRequestNextCounterTabStop = g.NavIdTabCounter + 1 + (g.IO.KeyShift ? -1 : 1);
        else
            g.FocusRequestNextCounterTabStop = g.IO.KeyShift ? -1 : 0;
    }

    // Turn queued focus request into current one
    g.FocusRequestCurrWindow = NULL;
    g.FocusRequestCurrCounterRegular = g.FocusRequestCurrCounterTabStop = INT_MAX;
    if (g.FocusRequestNextWindow != NULL)
    {
        ImGuiWindow* window = g.FocusRequestNextWindow;
        g.FocusRequestCurrWindow = window;
        if (g.FocusRequestNextCounterRegular != INT_MAX && window->DC.FocusCounterRegular != -1)
            g.FocusRequestCurrCounterRegular = ImModPositive(g.FocusRequestNextCounterRegular, window->DC.FocusCounterRegular + 1);
        if (g.FocusRequestNextCounterTabStop != INT_MAX && window->DC.FocusCounterTabStop != -1)
            g.FocusRequestCurrCounterTabStop = ImModPositive(g.FocusRequestNextCounterTabStop, window->DC.FocusCounterTabStop + 1);
        g.FocusRequestNextWindow = NULL;
        g.FocusRequestNextCounterRegular = g.FocusRequestNextCounterTabStop = INT_MAX;
    }

    g.NavIdTabCounter = INT_MAX;

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.IO.ConfigWindowsMemoryCompactTimer >= 0.0f) ? (float)g.Time - g.IO.ConfigWindowsMemoryCompactTimer : FLT_MAX;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect (this is totally functional but we may need decide if the side-effects are desirable)
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    g.WithinFrameScopeWithImplicitWindow = true;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PostNewFrame(&g);
#endif
}